

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::AnnotateSize
          (RepeatedField<long> *this,int old_size,int new_size)

{
  bool is_soo_00;
  long *elem;
  bool is_soo;
  int new_size_local;
  int old_size_local;
  RepeatedField<long> *this_local;
  
  if (old_size != new_size) {
    is_soo_00 = RepeatedField<long>::is_soo(this);
    unsafe_elements(this,is_soo_00);
  }
  return;
}

Assistant:

void AnnotateSize(int old_size, int new_size) const {
    if (old_size != new_size) {
      [[maybe_unused]] const bool is_soo = this->is_soo();
      [[maybe_unused]] const Element* elem = unsafe_elements(is_soo);
      ABSL_ANNOTATE_CONTIGUOUS_CONTAINER(elem, elem + Capacity(is_soo),
                                         elem + old_size, elem + new_size);
      if (new_size < old_size) {
        ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(
            elem + new_size, (old_size - new_size) * sizeof(Element));
      }
    }
  }